

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::calculateGraphs
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  long lVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  bool *pbVar6;
  undefined4 in_ESI;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *in_RDI;
  long in_FS_OFFSET;
  bool feasible;
  QList<QtGraphicsAnchorLayout::AnchorData_*> partVariables;
  GraphPath trunkPath;
  AnchorVertex *v;
  QList<QtGraphicsAnchorLayout::AnchorData_*> trunkVariables;
  GraphParts parts;
  undefined4 in_stack_ffffffffffffff38;
  Orientation in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 uVar8;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *this_00;
  undefined8 in_stack_ffffffffffffff60;
  Orientation orientation_00;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff68;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff70;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff78;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *variables;
  QList<QSimplexConstraint_*> *constraints;
  GraphPath *path;
  Orientation orientation_01;
  QGraphicsAnchorLayoutPrivate *pQVar9;
  char local_28 [12];
  Orientation in_stack_ffffffffffffffe4;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffffe8;
  
  orientation_00 = (Orientation)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if (calculateGraphs(Qt::Orientation)::simplificationEnabled == '\0') {
    iVar5 = __cxa_guard_acquire(&calculateGraphs(Qt::Orientation)::simplificationEnabled);
    if (iVar5 != 0) {
      bVar3 = qEnvironmentVariableIsEmpty("QT_ANCHORLAYOUT_NO_SIMPLIFICATION");
      calculateGraphs::simplificationEnabled = (bool)(bVar3 & 1);
      __cxa_guard_release(&calculateGraphs(Qt::Orientation)::simplificationEnabled);
    }
  }
  refreshAllSizeHints(in_stack_ffffffffffffff78,
                      (Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if ((calculateGraphs::simplificationEnabled & 1U) != 0) {
    bVar4 = simplifyGraph((QGraphicsAnchorLayoutPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff50)
                          ,(Orientation)((ulong)in_RDI >> 0x20));
    if (!bVar4) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_ESI,in_stack_ffffffffffffff50),(char *)in_RDI,
                 in_stack_ffffffffffffff44,
                 (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QMessageLogger::warning(local_28,"QGraphicsAnchorLayout: anchor setup is not feasible.");
      pbVar6 = QHVContainer<bool>::operator[]
                         ((QHVContainer<bool> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff3c);
      *pbVar6 = true;
      goto LAB_0093e9bd;
    }
  }
  findPaths(in_stack_ffffffffffffff68,orientation_00);
  constraintsFromPaths(in_stack_ffffffffffffff68,orientation_00);
  memset(&stack0xffffffffffffffa8,0,0x30);
  variables = (QList<QtGraphicsAnchorLayout::AnchorData_*> *)&DAT_aaaaaaaaaaaaaaaa;
  constraints = (QList<QSimplexConstraint_*> *)&DAT_aaaaaaaaaaaaaaaa;
  path = (GraphPath *)&DAT_aaaaaaaaaaaaaaaa;
  orientation_01 = 0xaaaaaaaa;
  pQVar9 = (QGraphicsAnchorLayoutPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  getGraphParts(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  getVariables((QList<QSimplexConstraint_*> *)in_stack_ffffffffffffff70);
  QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
            ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c
            );
  QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
  ::operator[]((QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c);
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::value
            (this_00,(AnchorVertex **)CONCAT44(in_ESI,in_stack_ffffffffffffff50));
  bVar4 = calculateTrunk(pQVar9,orientation_01,path,constraints,variables);
  iVar5 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffff50);
  if (bVar4) {
    bVar4 = QList<QSimplexConstraint_*>::isEmpty((QList<QSimplexConstraint_*> *)0x93e898);
    if (!bVar4) {
      pQVar9 = (QGraphicsAnchorLayoutPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff68 = (QGraphicsAnchorLayoutPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff70 = (QGraphicsAnchorLayoutPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      getVariables((QList<QSimplexConstraint_*> *)&DAT_aaaaaaaaaaaaaaaa);
      bVar4 = calculateNonTrunk(pQVar9,(QList<QSimplexConstraint_*> *)this_00,
                                (QList<QtGraphicsAnchorLayout::AnchorData_*> *)
                                CONCAT44(in_ESI,iVar5));
      orientation_00 = (Orientation)((ulong)pQVar9 >> 0x20);
      iVar5 = (uint)bVar4 << 0x18;
      QList<QtGraphicsAnchorLayout::AnchorData_*>::~QList
                ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)0x93e8fb);
    }
  }
  uVar8 = (undefined1)((uint)iVar5 >> 0x18);
  updateAnchorSizes(in_stack_ffffffffffffff70,
                    (Orientation)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  uVar2 = CONCAT13(uVar8,(int3)in_stack_ffffffffffffff44);
  uVar7 = uVar2 ^ 0xff000000;
  pbVar6 = QHVContainer<bool>::operator[]
                     ((QHVContainer<bool> *)
                      (CONCAT44(uVar2,in_stack_ffffffffffffff40) ^ 0xff00000000000000),
                      in_stack_ffffffffffffff3c);
  *pbVar6 = (bool)((byte)(uVar7 >> 0x18) & 1);
  QHVContainer<QList<QSimplexConstraint_*>_>::operator[]
            ((QHVContainer<QList<QSimplexConstraint_*>_> *)CONCAT44(uVar7,in_stack_ffffffffffffff40)
             ,in_stack_ffffffffffffff3c);
  qDeleteAll<QList<QSimplexConstraint*>>
            ((QList<QSimplexConstraint_*> *)CONCAT44(uVar7,in_stack_ffffffffffffff40));
  QHVContainer<QList<QSimplexConstraint_*>_>::operator[]
            ((QHVContainer<QList<QSimplexConstraint_*>_> *)CONCAT44(uVar7,in_stack_ffffffffffffff40)
             ,in_stack_ffffffffffffff3c);
  QList<QSimplexConstraint_*>::clear
            ((QList<QSimplexConstraint_*> *)CONCAT44(uVar7,in_stack_ffffffffffffff40));
  QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
  ::operator[]((QHVContainer<QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>_>
                *)CONCAT44(uVar7,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::clear
            ((QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
              *)CONCAT44(uVar7,in_stack_ffffffffffffff40));
  if ((calculateGraphs::simplificationEnabled & 1U) != 0) {
    restoreSimplifiedGraph(in_stack_ffffffffffffff68,orientation_00);
  }
  QtGraphicsAnchorLayout::GraphPath::~GraphPath
            ((GraphPath *)CONCAT44(uVar7,in_stack_ffffffffffffff40));
  QList<QtGraphicsAnchorLayout::AnchorData_*>::~QList
            ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)0x93e9b3);
  GraphParts::~GraphParts((GraphParts *)CONCAT44(uVar7,in_stack_ffffffffffffff40));
LAB_0093e9bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::calculateGraphs(Qt::Orientation orientation)
{
#if defined(QT_DEBUG) || defined(QT_BUILD_INTERNAL)
    lastCalculationUsedSimplex[orientation] = false;
#endif

    static bool simplificationEnabled = qEnvironmentVariableIsEmpty("QT_ANCHORLAYOUT_NO_SIMPLIFICATION");

    // Reset the nominal sizes of each anchor based on the current item sizes
    refreshAllSizeHints(orientation);

    // Simplify the graph
    if (simplificationEnabled && !simplifyGraph(orientation)) {
        qWarning("QGraphicsAnchorLayout: anchor setup is not feasible.");
        graphHasConflicts[orientation] = true;
        return;
    }

    // Traverse all graph edges and store the possible paths to each vertex
    findPaths(orientation);

    // From the paths calculated above, extract the constraints that the current
    // anchor setup impose, to our Linear Programming problem.
    constraintsFromPaths(orientation);

    // Split the constraints and anchors into groups that should be fed to the
    // simplex solver independently. Currently we find two groups:
    //
    //  1) The "trunk", that is, the set of anchors (items) that are connected
    //     to the two opposite sides of our layout, and thus need to stretch in
    //     order to fit in the current layout size.
    //
    //  2) The floating or semi-floating anchors (items) that are those which
    //     are connected to only one (or none) of the layout sides, thus are not
    //     influenced by the layout size.
    const auto parts = getGraphParts(orientation);

    // Now run the simplex solver to calculate Minimum, Preferred and Maximum sizes
    // of the "trunk" set of constraints and variables.
    // ### does trunk always exist? empty = trunk is the layout left->center->right
    const QList<AnchorData *> trunkVariables = getVariables(parts.trunkConstraints);

    // For minimum and maximum, use the path between the two layout sides as the
    // objective function.
    AnchorVertex *v = layoutLastVertex[orientation];
    GraphPath trunkPath = graphPaths[orientation].value(v);

    bool feasible = calculateTrunk(orientation, trunkPath, parts.trunkConstraints, trunkVariables);

    // For the other parts that not the trunk, solve only for the preferred size
    // that is the size they will remain at, since they are not stretched by the
    // layout.

    if (feasible && !parts.nonTrunkConstraints.isEmpty()) {
        const QList<AnchorData *> partVariables = getVariables(parts.nonTrunkConstraints);
        Q_ASSERT(!partVariables.isEmpty());
        feasible = calculateNonTrunk(parts.nonTrunkConstraints, partVariables);
    }

    // Propagate the new sizes down the simplified graph, ie. tell the
    // group anchors to set their children anchors sizes.
    updateAnchorSizes(orientation);

    graphHasConflicts[orientation] = !feasible;

    // Clean up our data structures. They are not needed anymore since
    // distribution uses just interpolation.
    qDeleteAll(constraints[orientation]);
    constraints[orientation].clear();
    graphPaths[orientation].clear(); // ###

    if (simplificationEnabled)
        restoreSimplifiedGraph(orientation);
}